

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O1

void __thiscall Mempool::Mempool(Mempool *this)

{
  (this->mp_pool)._M_h._M_buckets = &(this->mp_pool)._M_h._M_single_bucket;
  (this->mp_pool)._M_h._M_bucket_count = 1;
  (this->mp_pool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mp_pool)._M_h._M_element_count = 0;
  (this->mp_pool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mp_pool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mp_pool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->mp_total_size_kb = 0;
  this->mp_left_size_kb = 0;
  (this->mp_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mp_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mp_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mp_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->mp_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  mem_init(this,m4K,2000);
  mem_init(this,m16K,500);
  mem_init(this,m64K,0xfa);
  mem_init(this,m256K,100);
  mem_init(this,m1M,0x19);
  mem_init(this,m4M,10);
  this->mp_left_size_kb = this->mp_total_size_kb;
  return;
}

Assistant:

Mempool::Mempool() : mp_total_size_kb(0), mp_left_size_kb(0)
{
    mem_init(m4K, 2000);
    mem_init(m16K, 500);
    mem_init(m64K, 250);
    mem_init(m256K, 100);
    mem_init(m1M, 25);
    mem_init(m4M, 10);
    mp_left_size_kb = mp_total_size_kb;
}